

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QMovableArrayOps<QCss::StyleSheet>::emplace<QCss::StyleSheet_const&>
          (QMovableArrayOps<QCss::StyleSheet> *this,qsizetype i,StyleSheet *args)

{
  undefined1 uVar1;
  uint uVar2;
  qsizetype qVar3;
  undefined8 in_RDX;
  QArrayDataPointer<QCss::StyleSheet> *in_RSI;
  QArrayDataPointer<QCss::StyleSheet> *in_RDI;
  long in_FS_OFFSET;
  bool bVar4;
  GrowthPosition pos;
  bool growsAtBegin;
  bool detach;
  StyleSheet tmp;
  StyleSheet *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  undefined1 uVar5;
  undefined2 in_stack_ffffffffffffff14;
  byte bVar6;
  GrowthPosition where;
  Inserter local_d0;
  undefined1 local_a8 [160];
  long local_8;
  
  where = (GrowthPosition)((ulong)in_RDX >> 0x20);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = QArrayDataPointer<QCss::StyleSheet>::needsDetach
                    ((QArrayDataPointer<QCss::StyleSheet> *)
                     CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  if (!(bool)uVar1) {
    if ((in_RSI == (QArrayDataPointer<QCss::StyleSheet> *)in_RDI->size) &&
       (qVar3 = QArrayDataPointer<QCss::StyleSheet>::freeSpaceAtEnd(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QCss::StyleSheet>::end
                ((QArrayDataPointer<QCss::StyleSheet> *)
                 CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
      QCss::StyleSheet::StyleSheet
                ((StyleSheet *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffef8);
      in_RDI->size = in_RDI->size + 1;
      goto LAB_004696e4;
    }
    if ((in_RSI == (QArrayDataPointer<QCss::StyleSheet> *)0x0) &&
       (qVar3 = QArrayDataPointer<QCss::StyleSheet>::freeSpaceAtBegin(in_RDI), qVar3 != 0)) {
      QArrayDataPointer<QCss::StyleSheet>::begin((QArrayDataPointer<QCss::StyleSheet> *)0x4695aa);
      QCss::StyleSheet::StyleSheet
                ((StyleSheet *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                 in_stack_fffffffffffffef8);
      in_RDI->ptr = in_RDI->ptr + -1;
      in_RDI->size = in_RDI->size + 1;
      goto LAB_004696e4;
    }
  }
  memset(local_a8,0xaa,0xa0);
  QCss::StyleSheet::StyleSheet
            ((StyleSheet *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
             in_stack_fffffffffffffef8);
  bVar4 = in_RDI->size != 0;
  uVar5 = bVar4 && in_RSI == (QArrayDataPointer<QCss::StyleSheet> *)0x0;
  uVar2 = (uint)(bVar4 && in_RSI == (QArrayDataPointer<QCss::StyleSheet> *)0x0);
  bVar6 = uVar5;
  QArrayDataPointer<QCss::StyleSheet>::detachAndGrow
            (in_RSI,where,CONCAT17(uVar1,CONCAT16(uVar5,CONCAT24(in_stack_ffffffffffffff14,uVar2))),
             (StyleSheet **)in_RDI,
             (QArrayDataPointer<QCss::StyleSheet> *)CONCAT17(uVar5,in_stack_ffffffffffffff00));
  if ((bVar6 & 1) == 0) {
    Inserter::Inserter((Inserter *)
                       CONCAT17(uVar1,CONCAT16(bVar6,CONCAT24(in_stack_ffffffffffffff14,uVar2))),
                       in_RDI,CONCAT17(uVar5,in_stack_ffffffffffffff00),
                       (qsizetype)in_stack_fffffffffffffef8);
    Inserter::insertOne((Inserter *)CONCAT17(uVar5,in_stack_ffffffffffffff00),
                        in_stack_fffffffffffffef8);
    Inserter::~Inserter(&local_d0);
  }
  else {
    QArrayDataPointer<QCss::StyleSheet>::begin((QArrayDataPointer<QCss::StyleSheet> *)0x469672);
    QCss::StyleSheet::StyleSheet
              ((StyleSheet *)CONCAT17(uVar5,in_stack_ffffffffffffff00),in_stack_fffffffffffffef8);
    in_RDI->ptr = in_RDI->ptr + -1;
    in_RDI->size = in_RDI->size + 1;
  }
  QCss::StyleSheet::~StyleSheet((StyleSheet *)CONCAT17(uVar5,in_stack_ffffffffffffff00));
LAB_004696e4:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }